

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

IdList * sqlite3IdListDup(sqlite3 *db,IdList *p)

{
  IdList_item *pIVar1;
  IdList *p_00;
  IdList_item *pIVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  
  if ((p != (IdList *)0x0) && (p_00 = (IdList *)sqlite3DbMallocRaw(db,0x10), p_00 != (IdList *)0x0))
  {
    p_00->nId = p->nId;
    pIVar2 = (IdList_item *)sqlite3DbMallocRaw(db,p->nId << 4);
    p_00->a = pIVar2;
    if (pIVar2 != (IdList_item *)0x0) {
      if (p->nId < 1) {
        return p_00;
      }
      lVar4 = 8;
      lVar5 = 0;
      do {
        pIVar2 = p_00->a;
        pIVar1 = p->a;
        pcVar3 = sqlite3DbStrDup(db,*(char **)((long)pIVar1 + lVar4 + -8));
        *(char **)((long)pIVar2 + lVar4 + -8) = pcVar3;
        *(undefined4 *)((long)&pIVar2->zName + lVar4) =
             *(undefined4 *)((long)&pIVar1->zName + lVar4);
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 0x10;
      } while (lVar5 < p->nId);
      return p_00;
    }
    sqlite3DbFree(db,p_00);
  }
  return (IdList *)0x0;
}

Assistant:

SQLITE_PRIVATE IdList *sqlite3IdListDup(sqlite3 *db, IdList *p){
  IdList *pNew;
  int i;
  if( p==0 ) return 0;
  pNew = sqlite3DbMallocRaw(db, sizeof(*pNew) );
  if( pNew==0 ) return 0;
  pNew->nId = p->nId;
  pNew->a = sqlite3DbMallocRaw(db, p->nId*sizeof(p->a[0]) );
  if( pNew->a==0 ){
    sqlite3DbFree(db, pNew);
    return 0;
  }
  /* Note that because the size of the allocation for p->a[] is not
  ** necessarily a power of two, sqlite3IdListAppend() may not be called
  ** on the duplicate created by this function. */
  for(i=0; i<p->nId; i++){
    struct IdList_item *pNewItem = &pNew->a[i];
    struct IdList_item *pOldItem = &p->a[i];
    pNewItem->zName = sqlite3DbStrDup(db, pOldItem->zName);
    pNewItem->idx = pOldItem->idx;
  }
  return pNew;
}